

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricDistributionPoint::~IfcElectricDistributionPoint
          (IfcElectricDistributionPoint *this)

{
  IfcElement *this_00;
  long *plVar1;
  long *plVar2;
  
  *(undefined8 *)
   &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70 = 0x88eb28;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x58 = 0x88ec90;
  *(undefined8 *)
   &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.Representation.have = 0x88eb50;
  *(undefined8 *)
   &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.field_0x108 = 0x88eb78;
  *(undefined8 *)
   &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.field_0x140 = 0x88eba0;
  *(undefined8 *)&this[-1].super_IfcFlowController.field_0x170 = 0x88ebc8;
  this[-1].UserDefinedFunction.ptr.field_2._M_allocated_capacity = 0x88ebf0;
  *(undefined8 *)&this[-1].UserDefinedFunction.have = 0x88ec18;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x88ec40;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x88ec68;
  plVar2 = *(long **)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                      super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject
                      .field_0x30;
  plVar1 = (long *)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                    super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    field_0x40;
  if (plVar2 != plVar1) {
    operator_delete(plVar2,*plVar1 + 1);
  }
  this_00 = (IfcElement *)
            &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.
             super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject.
             field_0x70;
  plVar1 = *(long **)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                      super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject
                      .field_0x10;
  plVar2 = (long *)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                    super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    field_0x20;
  if (plVar1 != plVar2) {
    operator_delete(plVar1,*plVar2 + 1);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__0088ecc0);
  operator_delete(this_00,0x1d8);
  return;
}

Assistant:

IfcElectricDistributionPoint() : Object("IfcElectricDistributionPoint") {}